

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.hh
# Opt level: O1

void __thiscall Pl_PNGFilter::~Pl_PNGFilter(Pl_PNGFilter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  p_Var1 = (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ee028;
  pcVar2 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar3 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Pl_PNGFilter() final = default;